

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O3

gchar ** g_strsplit(gchar *string,gchar *delimiter,gint max_tokens)

{
  undefined8 *puVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *__dest;
  undefined8 *puVar5;
  undefined8 *puVar6;
  gchar **ppgVar7;
  char *__src;
  uint uVar8;
  uint uVar9;
  
  if ((delimiter == (gchar *)0x0 || string == (gchar *)0x0) || (*delimiter == '\0')) {
    return (gchar **)0x0;
  }
  pcVar3 = strstr(string,delimiter);
  if (pcVar3 != (char *)0x0) {
    sVar4 = strlen(delimiter);
    iVar2 = 0x7ffffffe;
    if (0 < max_tokens) {
      iVar2 = max_tokens + -1;
    }
    if (iVar2 != 0) {
      puVar6 = (undefined8 *)0x0;
      __src = string;
      uVar8 = 0;
      do {
        __dest = (char *)calloc(((long)pcVar3 - (long)__src) + 1,1);
        strncpy(__dest,__src,(long)pcVar3 - (long)__src);
        puVar5 = (undefined8 *)g_malloc(0x10);
        puVar5[1] = puVar6;
        *puVar5 = __dest;
        uVar9 = uVar8 + 1;
        __src = pcVar3 + sVar4;
        pcVar3 = strstr(__src,delimiter);
        if (iVar2 - 1U == uVar8) break;
        puVar6 = puVar5;
        uVar8 = uVar9;
      } while (pcVar3 != (char *)0x0);
      goto LAB_004cf714;
    }
  }
  uVar9 = 0;
  puVar5 = (undefined8 *)0x0;
  __src = string;
LAB_004cf714:
  puVar6 = puVar5;
  if (*string != '\0') {
    if (__src == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = strdup(__src);
    }
    uVar9 = uVar9 + 1;
    puVar6 = (undefined8 *)g_malloc(0x10);
    puVar6[1] = puVar5;
    *puVar6 = pcVar3;
  }
  ppgVar7 = (gchar **)g_malloc_n((ulong)(uVar9 + 1),8);
  ppgVar7[uVar9] = (gchar *)0x0;
  puVar5 = puVar6;
  if (puVar6 != (undefined8 *)0x0) {
    do {
      uVar9 = uVar9 - 1;
      ppgVar7[uVar9] = (gchar *)*puVar5;
      puVar1 = puVar5 + 1;
      puVar5 = (undefined8 *)*puVar1;
    } while ((undefined8 *)*puVar1 != (undefined8 *)0x0);
    do {
      puVar5 = (undefined8 *)puVar6[1];
      free(puVar6);
      puVar6 = puVar5;
    } while (puVar5 != (undefined8 *)0x0);
  }
  return ppgVar7;
}

Assistant:

gchar** g_strsplit (const gchar *string,
        const gchar *delimiter,
        gint         max_tokens)
{
    GSList *string_list = NULL, *slist;
    gchar **str_array, *s;
    guint n = 0;
    const gchar *remainder;

    if (string == NULL) return NULL;
    if (delimiter == NULL) return NULL;
    if (delimiter[0] == '\0') return NULL;

    if (max_tokens < 1)
        max_tokens = G_MAXINT;

    remainder = string;
    s = strstr (remainder, delimiter);
    if (s)
    {
        gsize delimiter_len = strlen (delimiter);

        while (--max_tokens && s)
        {
            gsize len;

            len = s - remainder;
            string_list = g_slist_prepend (string_list,
                    g_strndup (remainder, len));
            n++;
            remainder = s + delimiter_len;
            s = strstr (remainder, delimiter);
        }
    }
    if (*string)
    {
        n++;
        string_list = g_slist_prepend (string_list, g_strdup (remainder));
    }

    str_array = g_new (gchar*, n + 1);

    str_array[n--] = NULL;
    for (slist = string_list; slist; slist = slist->next)
        str_array[n--] = slist->data;

    g_slist_free (string_list);

    return str_array;
}